

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int __thiscall ImGuiStorage::GetInt(ImGuiStorage *this,ImGuiID key,int default_val)

{
  ImGuiStoragePair *pIVar1;
  ImGuiStoragePair *pIVar2;
  int in_EDX;
  ImGuiID in_ESI;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RDI;
  ImGuiStoragePair *it;
  int local_4;
  
  pIVar1 = LowerBound(in_RDI,in_ESI);
  pIVar2 = ImVector<ImGuiStorage::ImGuiStoragePair>::end(in_RDI);
  local_4 = in_EDX;
  if ((pIVar1 != pIVar2) && (pIVar1->key == in_ESI)) {
    local_4 = (pIVar1->field_1).val_i;
  }
  return local_4;
}

Assistant:

int ImGuiStorage::GetInt(ImGuiID key, int default_val) const
{
    ImGuiStoragePair* it = LowerBound(const_cast<ImVector<ImGuiStoragePair>&>(Data), key);
    if (it == Data.end() || it->key != key)
        return default_val;
    return it->val_i;
}